

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Constraint::operator==(Constraint *this,Constraint *other)

{
  ScalarEvolutionAnalysis *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  SENode *pSVar5;
  SENode *pSVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar7;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined8 *puVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_06;
  
  iVar2 = (**this->_vptr_Constraint)();
  if (((iVar2 == 1) && (iVar2 = (**other->_vptr_Constraint)(other), iVar2 == 0)) ||
     ((iVar2 = (**this->_vptr_Constraint)(this), iVar2 == 0 &&
      (iVar2 = (**other->_vptr_Constraint)(other), iVar2 == 1)))) {
    iVar2 = (*this->_vptr_Constraint[4])(this);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      this = other;
    }
    iVar2 = (*this->_vptr_Constraint[6])(this);
    pSVar5 = *(SENode **)(CONCAT44(extraout_var_00,iVar2) + 0x10);
    iVar2 = (*other->_vptr_Constraint[4])(other);
    lVar4 = CONCAT44(extraout_var_01,iVar2);
    this_00 = pSVar5->parent_analysis_;
    pSVar5 = ScalarEvolutionAnalysis::CreateNegation(this_00,pSVar5);
    pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar5);
    pSVar6 = ScalarEvolutionAnalysis::CreateConstant(this_00,1);
    bVar1 = SENode::operator==(pSVar6,*(SENode **)(lVar4 + 0x10));
    if (!bVar1) {
      return false;
    }
    pSVar6 = ScalarEvolutionAnalysis::CreateConstant(this_00,-1);
    bVar1 = SENode::operator==(pSVar6,*(SENode **)(lVar4 + 0x18));
    if (!bVar1) {
      return false;
    }
  }
  else {
    iVar2 = (**this->_vptr_Constraint)(this);
    iVar3 = (**other->_vptr_Constraint)(other);
    if (iVar2 != iVar3) {
      return false;
    }
    iVar2 = (*this->_vptr_Constraint[6])(this);
    if (CONCAT44(extraout_var_02,iVar2) != 0) {
      iVar2 = (*this->_vptr_Constraint[6])(this);
      pSVar5 = *(SENode **)(CONCAT44(extraout_var_03,iVar2) + 0x10);
      iVar2 = (*other->_vptr_Constraint[6])(other);
      puVar8 = (undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 0x10);
      goto LAB_005d3351;
    }
    iVar2 = (*this->_vptr_Constraint[4])(this);
    if (CONCAT44(extraout_var_05,iVar2) == 0) {
      iVar2 = (*this->_vptr_Constraint[8])(this);
      if (CONCAT44(extraout_var_08,iVar2) == 0) {
        return true;
      }
      iVar2 = (*this->_vptr_Constraint[8])(this);
      iVar3 = (*other->_vptr_Constraint[8])(other);
      bVar1 = SENode::operator==(*(SENode **)(CONCAT44(extraout_var_09,iVar2) + 0x10),
                                 *(SENode **)(CONCAT44(extraout_var_10,iVar3) + 0x10));
      if (!bVar1) {
        return false;
      }
      pSVar5 = *(SENode **)(CONCAT44(extraout_var_09,iVar2) + 0x18);
      puVar8 = (undefined8 *)(CONCAT44(extraout_var_10,iVar3) + 0x18);
      goto LAB_005d3351;
    }
    iVar2 = (*this->_vptr_Constraint[4])(this);
    lVar7 = CONCAT44(extraout_var_06,iVar2);
    iVar2 = (*other->_vptr_Constraint[4])(other);
    lVar4 = CONCAT44(extraout_var_07,iVar2);
    bVar1 = SENode::operator==(*(SENode **)(lVar7 + 0x10),*(SENode **)(lVar4 + 0x10));
    if (!bVar1) {
      return false;
    }
    bVar1 = SENode::operator==(*(SENode **)(lVar7 + 0x18),*(SENode **)(lVar4 + 0x18));
    if (!bVar1) {
      return false;
    }
    pSVar5 = *(SENode **)(lVar7 + 0x20);
  }
  puVar8 = (undefined8 *)(lVar4 + 0x20);
LAB_005d3351:
  bVar1 = SENode::operator==(pSVar5,(SENode *)*puVar8);
  return bVar1;
}

Assistant:

bool Constraint::operator==(const Constraint& other) const {
  // A distance of |d| is equivalent to a line |x - y = -d|
  if ((GetType() == ConstraintType::Distance &&
       other.GetType() == ConstraintType::Line) ||
      (GetType() == ConstraintType::Line &&
       other.GetType() == ConstraintType::Distance)) {
    auto is_distance = AsDependenceLine() != nullptr;

    auto as_distance =
        is_distance ? AsDependenceDistance() : other.AsDependenceDistance();
    auto distance = as_distance->GetDistance();

    auto line = other.AsDependenceLine();

    auto scalar_evolution = distance->GetParentAnalysis();

    auto neg_distance = scalar_evolution->SimplifyExpression(
        scalar_evolution->CreateNegation(distance));

    return *scalar_evolution->CreateConstant(1) == *line->GetA() &&
           *scalar_evolution->CreateConstant(-1) == *line->GetB() &&
           *neg_distance == *line->GetC();
  }

  if (GetType() != other.GetType()) {
    return false;
  }

  if (AsDependenceDistance()) {
    return *AsDependenceDistance()->GetDistance() ==
           *other.AsDependenceDistance()->GetDistance();
  }

  if (AsDependenceLine()) {
    auto this_line = AsDependenceLine();
    auto other_line = other.AsDependenceLine();
    return *this_line->GetA() == *other_line->GetA() &&
           *this_line->GetB() == *other_line->GetB() &&
           *this_line->GetC() == *other_line->GetC();
  }

  if (AsDependencePoint()) {
    auto this_point = AsDependencePoint();
    auto other_point = other.AsDependencePoint();

    return *this_point->GetSource() == *other_point->GetSource() &&
           *this_point->GetDestination() == *other_point->GetDestination();
  }

  return true;
}